

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

void av1_init_sc_decisions(AV1_PRIMARY *ppi)

{
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  AV1_COMP *pAVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar3 = ppi->num_fp_contexts;
  if (1 < (long)iVar3) {
    pAVar4 = ppi->cpi;
    _Var1 = (pAVar4->common).features.allow_screen_content_tools;
    _Var2 = (pAVar4->common).features.allow_intrabc;
    iVar5 = pAVar4->use_screen_content_tools;
    iVar6 = pAVar4->is_screen_content_type;
    lVar7 = 1;
    do {
      pAVar4 = ppi->parallel_cpi[lVar7];
      (pAVar4->common).features.allow_screen_content_tools = _Var1;
      (pAVar4->common).features.allow_intrabc = _Var2;
      pAVar4->use_screen_content_tools = iVar5;
      pAVar4->is_screen_content_type = iVar6;
      lVar7 = lVar7 + 1;
    } while (iVar3 != lVar7);
  }
  return;
}

Assistant:

void av1_init_sc_decisions(AV1_PRIMARY *const ppi) {
  AV1_COMP *const first_cpi = ppi->cpi;
  for (int i = 1; i < ppi->num_fp_contexts; ++i) {
    AV1_COMP *cur_cpi = ppi->parallel_cpi[i];
    cur_cpi->common.features.allow_screen_content_tools =
        first_cpi->common.features.allow_screen_content_tools;
    cur_cpi->common.features.allow_intrabc =
        first_cpi->common.features.allow_intrabc;
    cur_cpi->use_screen_content_tools = first_cpi->use_screen_content_tools;
    cur_cpi->is_screen_content_type = first_cpi->is_screen_content_type;
  }
}